

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLIFilePartLoader.cpp
# Opt level: O1

UniqueId * __thiscall
COLLADASaxFWL::IFilePartLoader::createUniqueIdFromUrl
          (IFilePartLoader *this,ParserChar *url,ClassId classId)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  undefined4 extraout_var_00;
  undefined1 *puVar3;
  URI uri;
  String local_130;
  URI local_110;
  
  puVar3 = COLLADAFW::UniqueId::INVALID;
  if ((url != (ParserChar *)0x0) && (*url != '\0')) {
    iVar1 = (*(this->super_ExtraDataLoader)._vptr_ExtraDataLoader[0xb])();
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    sVar2 = strlen(url);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,url,url + sVar2);
    COLLADABU::URI::URI(&local_110,(URI *)CONCAT44(extraout_var,iVar1),&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    iVar1 = (*(this->super_ExtraDataLoader)._vptr_ExtraDataLoader[7])(this);
    puVar3 = (undefined1 *)
             Loader::getUniqueId((Loader *)CONCAT44(extraout_var_00,iVar1),&local_110,classId);
    COLLADABU::URI::~URI(&local_110);
  }
  return (UniqueId *)puVar3;
}

Assistant:

const COLLADAFW::UniqueId& IFilePartLoader::createUniqueIdFromUrl( const ParserChar* url, COLLADAFW::ClassId classId )
	{
		COLLADABU_ASSERT( getColladaLoader() );
		if ( !url || !(*url) )
			return COLLADAFW::UniqueId::INVALID;

		COLLADABU::URI uri(getFileUri(), String((const char *)url));

		return getColladaLoader()->getUniqueId(uri, classId);
	}